

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::waitForReset
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ContextReset *pCVar1;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset_local;
  SyncObjectResetCase *this_local;
  
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  ContextReset::createSyncObject(pCVar1);
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  (*pCVar1->_vptr_ContextReset[4])();
  pCVar1 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  ContextReset::finish(pCVar1);
  return;
}

Assistant:

virtual void waitForReset (de::SharedPtr<ContextReset>& contextReset)
	{
		contextReset->createSyncObject();
		contextReset->teardown();
		contextReset->finish();
	}